

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

int skip_sep(LexState *ls)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  long in_RDI;
  int s;
  int count;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_2c;
  
  local_2c = 0;
  iVar1 = *(int *)(in_RDI + 0x20);
  if (*(uint *)(in_RDI + 0x44) < *(int *)(in_RDI + 0x40) + 1U) {
    save_grow((LexState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffbc);
  }
  else {
    uVar5 = *(uint *)(in_RDI + 0x40);
    *(uint *)(in_RDI + 0x40) = uVar5 + 1;
    *(char *)(*(long *)(in_RDI + 0x38) + (ulong)uVar5) = (char)*(undefined4 *)(in_RDI + 0x20);
  }
  iVar2 = *(int *)(in_RDI + 0x2c);
  *(int *)(in_RDI + 0x2c) = iVar2 + -1;
  if (iVar2 == 0) {
    uVar5 = fillbuf((LexState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    pbVar4 = *(byte **)(in_RDI + 0x30);
    *(byte **)(in_RDI + 0x30) = pbVar4 + 1;
    uVar5 = (uint)*pbVar4;
  }
  *(uint *)(in_RDI + 0x20) = uVar5;
  while (*(int *)(in_RDI + 0x20) == 0x3d) {
    if (*(uint *)(in_RDI + 0x44) < *(int *)(in_RDI + 0x40) + 1U) {
      save_grow((LexState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc);
    }
    else {
      uVar3 = *(uint *)(in_RDI + 0x40);
      *(uint *)(in_RDI + 0x40) = uVar3 + 1;
      *(char *)(*(long *)(in_RDI + 0x38) + (ulong)uVar3) = (char)*(undefined4 *)(in_RDI + 0x20);
    }
    iVar2 = *(int *)(in_RDI + 0x2c);
    *(int *)(in_RDI + 0x2c) = iVar2 + -1;
    if (iVar2 == 0) {
      in_stack_ffffffffffffffc8 = fillbuf((LexState *)CONCAT44(uVar5,in_stack_ffffffffffffffc8));
    }
    else {
      pbVar4 = *(byte **)(in_RDI + 0x30);
      *(byte **)(in_RDI + 0x30) = pbVar4 + 1;
      in_stack_ffffffffffffffc8 = (uint)*pbVar4;
    }
    *(uint *)(in_RDI + 0x20) = in_stack_ffffffffffffffc8;
    local_2c = local_2c + 1;
  }
  if (*(int *)(in_RDI + 0x20) != iVar1) {
    local_2c = -1 - local_2c;
  }
  return local_2c;
}

Assistant:

static int skip_sep(LexState *ls)
{
  int count = 0;
  int s = ls->current;
  lua_assert(s == '[' || s == ']');
  save_and_next(ls);
  while (ls->current == '=') {
    save_and_next(ls);
    count++;
  }
  return (ls->current == s) ? count : (-count) - 1;
}